

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayConstraintGraph(cmComputeLinkDepends *this)

{
  pointer pcVar1;
  FILE *__stream;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  allocator<char> local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  uVar3 = 0;
  while( true ) {
    __stream = _stderr;
    uVar4 = (ulong)uVar3;
    pcVar1 = (this->EntryConstraintGraph).
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pcVar1) / 0x18) <= uVar4) break;
    poVar2 = std::operator<<((ostream *)&e,"item ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," is [");
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((this->EntryList).
                                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar4));
    std::operator<<(poVar2,"]\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"  item ",&local_229);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8," must follow it",&local_22a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"\n",&local_22b);
    cmWrap<cmGraphEdgeList>(&local_208,&local_228,pcVar1 + uVar4,&local_1c8,&local_1e8);
    poVar2 = std::operator<<((ostream *)&e,(string *)&local_208);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_228);
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::stringbuf::str();
  fprintf(__stream,"%s\n",local_208._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayConstraintGraph()
{
  // Display the graph nodes and their edges.
  std::ostringstream e;
  for (unsigned int i = 0; i < this->EntryConstraintGraph.size(); ++i) {
    EdgeList const& nl = this->EntryConstraintGraph[i];
    e << "item " << i << " is [" << this->EntryList[i].Item << "]\n";
    e << cmWrap("  item ", nl, " must follow it", "\n") << "\n";
  }
  fprintf(stderr, "%s\n", e.str().c_str());
}